

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mf.cpp
# Opt level: O1

Complex __thiscall libDAI::MF::logZ(MF *this)

{
  int iVar1;
  undefined4 extraout_var;
  long lVar2;
  undefined4 extraout_var_00;
  ulong uVar3;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  TFactor<double> *this_00;
  undefined4 extraout_var_05;
  long lVar4;
  long *plVar5;
  size_t i;
  undefined1 auVar6 [16];
  Factor henk;
  Factor piet;
  ulong local_108;
  Factor local_d8;
  TFactor<double> local_a0;
  TFactor<double> local_68;
  
  iVar1 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[4])();
  lVar2 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x28))
                    ((long *)CONCAT44(extraout_var,iVar1));
  if (lVar2 != 0) {
    i = 0;
    do {
      beliefV(&local_d8,this,i);
      TProb<double>::entropy(&local_d8._p);
      if (local_d8._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_d8._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_d8._p._p.super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_d8._p._p.super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_d8._vs._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_d8._vs._vars.
                        super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_d8._vs._vars.
                              super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_d8._vs._vars.
                              super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      i = i + 1;
      iVar1 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[4])(this);
      uVar3 = (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar1) + 0x28))
                        ((long *)CONCAT44(extraout_var_00,iVar1));
    } while (i < uVar3);
  }
  iVar1 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[4])(this);
  auVar6 = (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar1) + 0x48))
                     ((long *)CONCAT44(extraout_var_01,iVar1));
  if (auVar6._0_8_ != 0) {
    local_108 = 0;
    do {
      TFactor<double>::TFactor(&local_d8);
      iVar1 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[4])(this);
      for (plVar5 = *(long **)(*(long *)(CONCAT44(extraout_var_02,iVar1) + 0x88) + local_108 * 0x18)
          ; iVar1 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[4])
                              (this),
          plVar5 != *(long **)(*(long *)(CONCAT44(extraout_var_03,iVar1) + 0x88) + 8 +
                              local_108 * 0x18); plVar5 = plVar5 + 1) {
        TFactor<double>::operator*=
                  (&local_d8,
                   (this->_beliefs).
                   super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + *plVar5);
      }
      TProb<double>::normalize(&local_d8._p,NORMPROB);
      TFactor<double>::TFactor(&local_a0);
      iVar1 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[4])(this);
      this_00 = (TFactor<double> *)
                (**(code **)(*(long *)CONCAT44(extraout_var_04,iVar1) + 0x50))
                          ((long *)CONCAT44(extraout_var_04,iVar1),local_108);
      TFactor<double>::log0(&local_68,this_00);
      TFactor<double>::operator=(&local_a0,&local_68);
      if (local_68._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_68._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_68._p._p.super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_68._p._p.super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_68._vs._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_68._vs._vars.
                        super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_68._vs._vars.
                              super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_68._vs._vars.
                              super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      TFactor<double>::operator*=(&local_a0,&local_d8);
      if ((long)local_a0._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_a0._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start != 0) {
        lVar2 = (long)local_a0._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)local_a0._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start >> 3;
        lVar4 = 0;
        do {
          lVar4 = lVar4 + 1;
        } while (lVar2 + (ulong)(lVar2 == 0) != lVar4);
      }
      if (local_a0._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_a0._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_a0._p._p.super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_a0._p._p.super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_a0._vs._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_a0._vs._vars.
                        super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_a0._vs._vars.
                              super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_a0._vs._vars.
                              super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_d8._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_d8._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_d8._p._p.super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_d8._p._p.super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_d8._vs._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_d8._vs._vars.
                        super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_d8._vs._vars.
                              super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_d8._vs._vars.
                              super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      local_108 = local_108 + 1;
      iVar1 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[4])(this);
      auVar6 = (**(code **)(*(long *)CONCAT44(extraout_var_05,iVar1) + 0x48))
                         ((long *)CONCAT44(extraout_var_05,iVar1));
    } while (local_108 < auVar6._0_8_);
  }
  return (Complex)(_ComplexT)auVar6;
}

Assistant:

Complex MF::logZ() const {
        Complex sum = 0.0;
        
        for(size_t i=0; i < grm().nrVars(); i++ )
            sum -= beliefV(i).entropy();
        for(size_t I=0; I < grm().nrFactors(); I++ ) {
            Factor henk;
            for( FactorGraph::nb_cit j = grm().nbF(I).begin(); j != grm().nbF(I).end(); j++ )   // for all j in I
                henk *= _beliefs[*j];
            henk.normalize();
            Factor piet;
            piet = grm().factor(I).log0();
            piet *= henk;
            sum -= Complex( piet.totalSum() );
        }

        return -sum;
    }